

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

IVec3 __thiscall tcu::calculatePackedPitch(tcu *this,TextureFormat *format,IVec3 *size)

{
  int iVar1;
  int iVar2;
  IVec3 IVar3;
  
  iVar1 = getPixelSize(*format);
  iVar2 = size->m_data[0] * iVar1;
  IVar3.m_data[2] = size->m_data[1] * iVar2;
  *(int *)this = iVar1;
  *(int *)(this + 4) = iVar2;
  *(int *)(this + 8) = IVar3.m_data[2];
  IVar3.m_data._0_8_ = this;
  return (IVec3)IVar3.m_data;
}

Assistant:

IVec3 calculatePackedPitch (const TextureFormat& format, const IVec3& size)
{
	const int pixelSize		= format.getPixelSize();
	const int rowPitch		= pixelSize * size.x();
	const int slicePitch	= rowPitch * size.y();

	return IVec3(pixelSize, rowPitch, slicePitch);
}